

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  char *pcVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream e;
  
  std::operator+(&bStack_218,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&bStack_218
                 ,"_COMPILE_FEATURES");
  pcVar1 = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&bStack_218);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar1 = "no";
    if (error == (string *)0x0) {
      pcVar1 = "No";
    }
    std::operator<<((ostream *)&e,pcVar1);
    poVar2 = std::operator<<((ostream *)&e," known features for ");
    poVar2 = std::operator<<(poVar2,(string *)lang);
    poVar2 = std::operator<<(poVar2," compiler\n\"");
    std::operator+(&local_1b8,"CMAKE_",lang);
    std::operator+(&bStack_218,&local_1b8,"_COMPILER_ID");
    pcVar1 = GetDefinition(this,&bStack_218);
    poVar2 = std::operator<<(poVar2,pcVar1);
    poVar2 = std::operator<<(poVar2,"\"\nversion ");
    std::operator+(&local_1f8,"CMAKE_",lang);
    std::operator+(&local_1d8,&local_1f8,"_COMPILER_VERSION");
    pcVar1 = GetDefinition(this,&local_1d8);
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2,".");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&bStack_218);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (error == (string *)0x0) {
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&bStack_218,false);
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)error,(string *)&bStack_218);
    }
    std::__cxx11::string::~string((string *)&bStack_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* cmMakefile::
CompileFeaturesAvailable(const std::string& lang, std::string *error) const
{
  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown)
    {
    std::ostringstream e;
    if (error)
      {
      e << "no";
      }
    else
      {
      e << "No";
      }
    e << " known features for " << lang << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error)
      {
      *error = e.str();
      }
    else
      {
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    return 0;
    }
  return featuresKnown;
}